

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

int __thiscall Assimp::ColladaParser::GetAttribute(ColladaParser *this,char *pAttr)

{
  int iVar1;
  undefined4 extraout_var;
  string local_1b0;
  ostringstream local_190 [376];
  
  iVar1 = TestAttribute(this,pAttr);
  if (iVar1 != -1) {
    return iVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"Expected attribute \"");
  std::operator<<((ostream *)local_190,pAttr);
  std::operator<<((ostream *)local_190,"\" for element <");
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::operator<<((ostream *)local_190,(char *)CONCAT44(extraout_var,iVar1));
  std::operator<<((ostream *)local_190,">.");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1b0);
}

Assistant:

int ColladaParser::GetAttribute(const char* pAttr) const
{
    int index = TestAttribute(pAttr);
    if (index != -1)
        return index;

    // attribute not found -> throw an exception
    ThrowException(format() << "Expected attribute \"" << pAttr << "\" for element <" << mReader->getNodeName() << ">.");
    return -1;
}